

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O0

void add_metrics_routines(stone_type stone,cod_parse_context context)

{
  undefined8 in_RSI;
  
  add_metrics_routines::externs[0].extern_value = dgettimeofday;
  add_metrics_routines::externs[1].extern_value = hw_cpus;
  add_metrics_routines::externs[2].extern_value = hw_cpu_min_freq;
  add_metrics_routines::externs[3].extern_value = hw_cpu_max_freq;
  add_metrics_routines::externs[4].extern_value = hw_cpu_curr_freq;
  add_metrics_routines::externs[5].extern_value = os_type;
  add_metrics_routines::externs[6].extern_value = os_release;
  add_metrics_routines::externs[7].extern_value = hostname;
  add_metrics_routines::externs[8].extern_value = stat_uptime;
  add_metrics_routines::externs[9].extern_value = stat_loadavg_one;
  add_metrics_routines::externs[10].extern_value = stat_loadavg_five;
  add_metrics_routines::externs[0xb].extern_value = stat_loadavg_fifteen;
  add_metrics_routines::externs[0xc].extern_value = vm_mem_total;
  add_metrics_routines::externs[0xd].extern_value = vm_mem_free;
  add_metrics_routines::externs[0xe].extern_value = vm_swap_total;
  add_metrics_routines::externs[0xf].extern_value = vm_swap_free;
  cod_assoc_externs(in_RSI,add_metrics_routines::externs);
  cod_parse_for_context(add_metrics_routines::extern_string,in_RSI);
  return;
}

Assistant:

void
add_metrics_routines(stone_type stone, cod_parse_context context)
{
    static char extern_string[] = "\
       double    dgettimeofday();         \n		\
/* number of cpus */  \n				\
       int           hw_cpus();           \n		\
/* minimum allowed frequency in MHz */ \n	\
       long           hw_cpu_min_freq();    \n \
/* maximum allowed frequency in MHz  */ \n	\
       long           hw_cpu_max_freq();   \n	\
/* current frequency  in Mhz */ \n	\
       long           hw_cpu_curr_freq();  \n	\
/* a string to identify the local OS type -- ie Linux  */ \n 	\
       char*       os_type();              \n	\
/* a string to identify the current release -- ie FC14 */  \n	\
       char*       os_release();          \n\
/* a string to identify the hostname -- ie maquis1 */  \n	\
       char*       hostname();          \n\
/* time in seconds that the computer has been up  */  \n	\
       double    stat_uptime();           \n\
/* load average over the last one minute  */ \n	\
       double    stat_loadavg_one();       \n	\
/* load average over the last five minutes  */ \n	\
       double    stat_loadavg_five();      \n	\
/* load average over the last fifteen minute  */ \n	\
       double    stat_loadavg_fifteen();   \n	\
/* total physical memory  */  \n	\
       unsigned long    vm_mem_total();   \n	\
/* free physical memory   */ \n	\
       unsigned long    vm_mem_free();    \n	\
/* total swap available */  \n	\
       unsigned long    vm_swap_total();   \n	\
/* free swap  */  \n	\
       unsigned long    vm_swap_free();     \n";

    static cod_extern_entry externs[] = {
	{"dgettimeofday", (void *) 0},	        // 0
	{"hw_cpus", (void *) 0},		// 1
	{"hw_cpu_min_freq", (void *) 0},	// 2
	{"hw_cpu_max_freq", (void *) 0},	// 3
	{"hw_cpu_curr_freq", (void *) 0},	// 4
	{"os_type", (void *) 0},		// 5
	{"os_release", (void *) 0},		// 6
	{"hostname", (void *) 0},               // 7
	{"stat_uptime", (void *) 0},		// 8
	{"stat_loadavg_one", (void *) 0},	// 9
	{"stat_loadavg_five", (void *) 0},	// 10
	{"stat_loadavg_fifteen", (void *) 0},	// 11
	{"vm_mem_total", (void *) 0},		// 12
	{"vm_mem_free", (void *) 0},		// 13
	{"vm_swap_total", (void *) 0},		// 14
	{"vm_swap_free", (void*) 0},		// 15
	{(void *) 0, (void *) 0}
    };

    (void) stone;
    /*
     * some compilers think it isn't a static initialization to put this
     * in the structure above, so do it explicitly.
     */
    externs[0].extern_value = (void *) (intptr_t) dgettimeofday;
    externs[1].extern_value = (void *) (intptr_t) hw_cpus;
    externs[2].extern_value = (void *) (intptr_t) hw_cpu_min_freq;
    externs[3].extern_value = (void *) (intptr_t) hw_cpu_max_freq;
    externs[4].extern_value = (void *) (intptr_t) hw_cpu_curr_freq;
    externs[5].extern_value = (void *) (intptr_t) os_type;
    externs[6].extern_value = (void *) (intptr_t) os_release;
    externs[7].extern_value = (void *) (intptr_t) hostname;
    externs[8].extern_value = (void *) (intptr_t) stat_uptime;
    externs[9].extern_value = (void *) (intptr_t) stat_loadavg_one;
    externs[10].extern_value = (void *) (intptr_t) stat_loadavg_five;
    externs[11].extern_value = (void *) (intptr_t) stat_loadavg_fifteen;
    externs[12].extern_value = (void *) (intptr_t) vm_mem_total;
    externs[13].extern_value = (void *) (intptr_t) vm_mem_free;
    externs[14].extern_value = (void *) (intptr_t) vm_swap_total;
    externs[15].extern_value = (void *) (intptr_t) vm_swap_free;

    cod_assoc_externs(context, externs);
    cod_parse_for_context(extern_string, context);
}